

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64emithelper.cpp
# Opt level: O0

Error __thiscall asmjit::_abi_1_10::a64::EmitHelper::emitProlog(EmitHelper *this,FuncFrame *frame)

{
  bool bVar1;
  uint32_t uVar2;
  Error EVar3;
  RegPair *pRVar4;
  FuncFrame *in_RSI;
  long in_RDI;
  Error _err_6;
  Error _err_5;
  Error _err_4;
  uint32_t adj;
  Error _err_3;
  Error _err_2;
  Error _err_1;
  RegPair *pair;
  uint32_t i;
  LoadStoreInstructions *insts;
  Mem mem;
  Reg regs [2];
  uint32_t pairCount;
  GroupData *data;
  RegGroup group;
  Iterator __end2;
  Iterator __begin2;
  EnumValues<asmjit::_abi_1_10::RegGroup,_(asmjit::_abi_1_10::RegGroup)0,_(asmjit::_abi_1_10::RegGroup)1>
  *__range2;
  uint32_t adjustInitialOffset;
  Error _err;
  PrologEpilogInfo pei;
  Emitter *emitter;
  Reg *in_stack_fffffffffffffe68;
  Emitter *o2;
  EmitterExplicitT<asmjit::_abi_1_10::a64::Emitter> *in_stack_fffffffffffffe70;
  Emitter *pEVar5;
  Mem *in_stack_fffffffffffffe78;
  EmitterExplicitT<asmjit::_abi_1_10::a64::Emitter> *in_stack_fffffffffffffe80;
  uint32_t predicate;
  undefined4 in_stack_fffffffffffffe88;
  InstId in_stack_fffffffffffffe8c;
  BaseEmitter *in_stack_fffffffffffffe90;
  InstId in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  uint local_114;
  BaseMem local_108;
  BaseReg local_f8;
  BaseReg BStack_e8;
  uint32_t local_d4;
  GroupData *local_d0;
  RegGroup local_c4;
  Iterator local_c3;
  Iterator local_c2;
  EnumValues<asmjit::_abi_1_10::RegGroup,_(asmjit::_abi_1_10::RegGroup)0,_(asmjit::_abi_1_10::RegGroup)1>
  local_c1;
  EnumValues<asmjit::_abi_1_10::RegGroup,_(asmjit::_abi_1_10::RegGroup)0,_(asmjit::_abi_1_10::RegGroup)1>
  *local_c0;
  uint32_t local_b4;
  Error local_b0;
  PrologEpilogInfo local_ac;
  Emitter *local_20;
  FuncFrame *local_18;
  
  local_18 = in_RSI;
  local_20 = BaseEmitter::as<asmjit::_abi_1_10::a64::Emitter>(*(BaseEmitter **)(in_RDI + 8));
  local_b0 = PrologEpilogInfo::init(&local_ac,(EVP_PKEY_CTX *)local_18);
  if (local_b0 != 0) {
    return local_b0;
  }
  local_b4 = local_ac.sizeTotal;
  local_c0 = &local_c1;
  local_c2 = Support::
             EnumValues<asmjit::_abi_1_10::RegGroup,_(asmjit::_abi_1_10::RegGroup)0,_(asmjit::_abi_1_10::RegGroup)1>
             ::begin(local_c0);
  local_c3 = Support::
             EnumValues<asmjit::_abi_1_10::RegGroup,_(asmjit::_abi_1_10::RegGroup)0,_(asmjit::_abi_1_10::RegGroup)1>
             ::end(local_c0);
  while (bVar1 = Support::
                 EnumValues<asmjit::_abi_1_10::RegGroup,_(asmjit::_abi_1_10::RegGroup)0,_(asmjit::_abi_1_10::RegGroup)1>
                 ::Iterator::operator!=(&local_c2,&local_c3), bVar1) {
    local_c4 = Support::
               EnumValues<asmjit::_abi_1_10::RegGroup,_(asmjit::_abi_1_10::RegGroup)0,_(asmjit::_abi_1_10::RegGroup)1>
               ::Iterator::operator*(&local_c2);
    local_d0 = Support::Array<asmjit::_abi_1_10::a64::PrologEpilogInfo::GroupData,_2UL>::
               operator[]<asmjit::_abi_1_10::RegGroup>
                         ((Array<asmjit::_abi_1_10::a64::PrologEpilogInfo::GroupData,_2UL> *)
                          in_stack_fffffffffffffe70,(RegGroup *)in_stack_fffffffffffffe68);
    local_d4 = local_d0->pairCount;
    Support::Array<asmjit::_abi_1_10::arm::Reg,_2UL>::operator[]<asmjit::_abi_1_10::RegGroup>
              ((Array<asmjit::_abi_1_10::arm::Reg,_2UL> *)in_stack_fffffffffffffe70,
               (RegGroup *)in_stack_fffffffffffffe68);
    arm::Reg::Reg((Reg *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    in_stack_fffffffffffffe80 = (EmitterExplicitT<asmjit::_abi_1_10::a64::Emitter> *)&BStack_e8;
    Support::Array<asmjit::_abi_1_10::arm::Reg,_2UL>::operator[]<asmjit::_abi_1_10::RegGroup>
              ((Array<asmjit::_abi_1_10::arm::Reg,_2UL> *)in_stack_fffffffffffffe70,
               (RegGroup *)in_stack_fffffffffffffe68);
    arm::Reg::Reg((Reg *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    arm::ptr((Gp *)in_stack_fffffffffffffe78,(int32_t)((ulong)in_stack_fffffffffffffe70 >> 0x20));
    Support::Array<asmjit::_abi_1_10::a64::LoadStoreInstructions,_2UL>::
    operator[]<asmjit::_abi_1_10::RegGroup>
              ((Array<asmjit::_abi_1_10::a64::LoadStoreInstructions,_2UL> *)
               in_stack_fffffffffffffe70,(RegGroup *)in_stack_fffffffffffffe68);
    for (local_114 = 0; local_114 < local_d4; local_114 = local_114 + 1) {
      pRVar4 = local_d0->pairs + local_114;
      BaseReg::setId(&local_f8,(uint)pRVar4->ids[0]);
      BaseReg::setId(&BStack_e8,(uint)pRVar4->ids[1]);
      BaseMem::setOffsetLo32(&local_108,(uint)pRVar4->offset);
      if ((pRVar4->offset == 0) && (local_b4 != 0)) {
        BaseMem::setOffset((BaseMem *)in_stack_fffffffffffffe80,(int64_t)in_stack_fffffffffffffe78);
        arm::Mem::makePreIndex((Mem *)0x1684f2);
      }
      if (pRVar4->ids[1] == 0xff) {
        EVar3 = BaseEmitter::emit<asmjit::_abi_1_10::arm::Reg&,asmjit::_abi_1_10::arm::Mem&>
                          (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                           (Reg *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      }
      else {
        EVar3 = BaseEmitter::
                emit<asmjit::_abi_1_10::arm::Reg&,asmjit::_abi_1_10::arm::Reg&,asmjit::_abi_1_10::arm::Mem&>
                          ((BaseEmitter *)
                           CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                           in_stack_fffffffffffffe9c,(Reg *)in_stack_fffffffffffffe90,
                           (Reg *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                           (Mem *)in_stack_fffffffffffffe80);
      }
      if (EVar3 != 0) {
        return EVar3;
      }
      arm::Mem::resetToFixedOffset((Mem *)0x1685c2);
      if (((local_114 == 0) && (bVar1 = FuncFrame::hasPreservedFP((FuncFrame *)0x1685d9), bVar1)) &&
         (EVar3 = EmitterExplicitT<asmjit::_abi_1_10::a64::Emitter>::mov
                            (in_stack_fffffffffffffe70,(Gp *)in_stack_fffffffffffffe68,
                             (Gp *)0x1685fc), EVar3 != 0)) {
        return EVar3;
      }
    }
    Support::
    EnumValues<asmjit::_abi_1_10::RegGroup,_(asmjit::_abi_1_10::RegGroup)0,_(asmjit::_abi_1_10::RegGroup)1>
    ::Iterator::operator++(&local_c2);
  }
  bVar1 = FuncFrame::hasStackAdjustment(local_18);
  if (bVar1) {
    uVar2 = FuncFrame::stackAdjustment(local_18);
    predicate = (uint32_t)((ulong)in_stack_fffffffffffffe80 >> 0x20);
    if (uVar2 < 0x1000) {
      pEVar5 = local_20;
      Imm::Imm<unsigned_int,void>
                ((Imm *)in_stack_fffffffffffffe90,
                 (uint *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),predicate);
      EVar3 = EmitterExplicitT<asmjit::_abi_1_10::a64::Emitter>::sub
                        (in_stack_fffffffffffffe80,(Gp *)pEVar5,(Gp *)in_stack_fffffffffffffe70,
                         (Imm *)in_stack_fffffffffffffe68);
    }
    else {
      if (0xffffff < uVar2) {
        EVar3 = DebugUtils::errored(3);
        return EVar3;
      }
      pEVar5 = local_20;
      Imm::Imm<unsigned_int,void>
                ((Imm *)in_stack_fffffffffffffe90,
                 (uint *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),predicate);
      EVar3 = EmitterExplicitT<asmjit::_abi_1_10::a64::Emitter>::sub
                        (in_stack_fffffffffffffe80,(Gp *)in_stack_fffffffffffffe78,(Gp *)pEVar5,
                         (Imm *)in_stack_fffffffffffffe68);
      if (EVar3 != 0) {
        return EVar3;
      }
      o2 = local_20;
      Imm::Imm<unsigned_int,void>
                ((Imm *)in_stack_fffffffffffffe90,
                 (uint *)(CONCAT44(uVar2,in_stack_fffffffffffffe88) & 0xfff000ffffffff),
                 (uint32_t)((ulong)in_stack_fffffffffffffe80 >> 0x20));
      EVar3 = EmitterExplicitT<asmjit::_abi_1_10::a64::Emitter>::sub
                        (in_stack_fffffffffffffe80,(Gp *)in_stack_fffffffffffffe78,(Gp *)pEVar5,
                         (Imm *)o2);
    }
    if (EVar3 != 0) {
      return EVar3;
    }
  }
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE Error EmitHelper::emitProlog(const FuncFrame& frame) {
  Emitter* emitter = _emitter->as<Emitter>();

  PrologEpilogInfo pei;
  ASMJIT_PROPAGATE(pei.init(frame));

  static const Support::Array<Reg, 2> groupRegs = {{ x0, d0 }};
  static const Support::Array<LoadStoreInstructions, 2> groupInsts = {{
    { Inst::kIdStr  , Inst::kIdStp   },
    { Inst::kIdStr_v, Inst::kIdStp_v }
  }};

  uint32_t adjustInitialOffset = pei.sizeTotal;

  for (RegGroup group : Support::EnumValues<RegGroup, RegGroup::kGp, RegGroup::kVec>{}) {
    const PrologEpilogInfo::GroupData& data = pei.groups[group];
    uint32_t pairCount = data.pairCount;

    Reg regs[2] = { groupRegs[group], groupRegs[group] };
    Mem mem = ptr(sp);

    const LoadStoreInstructions& insts = groupInsts[group];
    for (uint32_t i = 0; i < pairCount; i++) {
      const PrologEpilogInfo::RegPair& pair = data.pairs[i];

      regs[0].setId(pair.ids[0]);
      regs[1].setId(pair.ids[1]);
      mem.setOffsetLo32(pair.offset);

      if (pair.offset == 0 && adjustInitialOffset) {
        mem.setOffset(-int(adjustInitialOffset));
        mem.makePreIndex();
      }

      if (pair.ids[1] == BaseReg::kIdBad)
        ASMJIT_PROPAGATE(emitter->emit(insts.singleInstId, regs[0], mem));
      else
        ASMJIT_PROPAGATE(emitter->emit(insts.pairInstId, regs[0], regs[1], mem));

      mem.resetToFixedOffset();

      if (i == 0 && frame.hasPreservedFP()) {
        ASMJIT_PROPAGATE(emitter->mov(x29, sp));
      }
    }
  }

  if (frame.hasStackAdjustment()) {
    uint32_t adj = frame.stackAdjustment();
    if (adj <= 0xFFFu) {
      ASMJIT_PROPAGATE(emitter->sub(sp, sp, adj));
    }
    else if (adj <= 0xFFFFFFu)  {
      // TODO: [ARM] Prolog - we must touch the pages otherwise it's undefined.
      ASMJIT_PROPAGATE(emitter->sub(sp, sp, adj & 0x000FFFu));
      ASMJIT_PROPAGATE(emitter->sub(sp, sp, adj & 0xFFF000u));
    }
    else {
      return DebugUtils::errored(kErrorInvalidState);
    }
  }

  return kErrorOk;
}